

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_dc_128_predictor_4x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *puVar1;
  uint uVar2;
  
  uVar2 = 0xfffffffe;
  do {
    dst[0] = 0x80;
    dst[1] = 0x80;
    dst[2] = 0x80;
    dst[3] = 0x80;
    puVar1 = dst + stride;
    puVar1[0] = 0x80;
    puVar1[1] = 0x80;
    puVar1[2] = 0x80;
    puVar1[3] = 0x80;
    dst = dst + stride * 2;
    uVar2 = uVar2 + 2;
  } while (uVar2 < 6);
  return;
}

Assistant:

void aom_dc_128_predictor_4x8_sse2(uint8_t *dst, ptrdiff_t stride,
                                   const uint8_t *above, const uint8_t *left) {
  (void)above;
  (void)left;
  const uint32_t pred = 0x80808080;
  dc_store_4xh(pred, 8, dst, stride);
}